

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_normal.c
# Opt level: O0

void prf_obsolete_vertex_with_normal_fill_vertex(prf_node_t *node,prf_vertex_t *vertex)

{
  uint *puVar1;
  node_data_conflict10 *data;
  bool_t complete;
  int pos;
  prf_vertex_t *vertex_local;
  prf_node_t *node_local;
  
  puVar1 = (uint *)node->data;
  vertex->x = (float64_t)(double)*puVar1;
  vertex->y = (float64_t)(double)puVar1[1];
  vertex->z = (float64_t)(double)puVar1[2];
  return;
}

Assistant:

void
prf_obsolete_vertex_with_normal_fill_vertex(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    int pos = 4;
    bool_t complete = FALSE;

    assert( node != NULL && vertex != NULL );

    do {
        node_data * data = (node_data *) node->data;
        prf_dblwrite( vertex->x, (float64_t) data->x ); pos += 8;
        prf_dblwrite( vertex->y, (float64_t) data->y ); pos += 8;
        prf_dblwrite( vertex->z, (float64_t) data->z ); pos += 8;
        complete = TRUE;
    } while ( FALSE );

}